

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformSelect(Impl *this,Atom_t h)

{
  size_type sVar1;
  int iVar2;
  pointer pWVar3;
  pointer plVar4;
  uint32 uVar5;
  size_type sVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  uint *puVar10;
  uint32 uVar11;
  uint uVar12;
  Atom_t local_6c;
  AtomSpan local_68;
  VarVec *local_58;
  ulong local_50;
  LitVec *local_48;
  LitSpan local_40;
  
  local_48 = &this->lits_;
  lVar9 = 0;
  (this->lits_).ebo_.size = 0;
  (this->aux_).ebo_.size = 0;
  sVar1 = (this->agg_).ebo_.size;
  local_50 = (ulong)(h != 0);
  uVar7 = 0;
  uVar11 = 0;
  local_58 = &this->aux_;
  while( true ) {
    if (lVar9 < this->bound_) {
      do {
        pWVar3 = (this->agg_).ebo_.buf;
        lVar9 = lVar9 + pWVar3[uVar7].weight;
        local_68.first._0_4_ = pWVar3[uVar7].lit;
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(local_48,(int *)&local_68);
        local_68.first = (uint *)CONCAT44(local_68.first._4_4_,(int)uVar7);
        uVar7 = (ulong)((int)uVar7 + 1);
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->aux_,(uint *)&local_68);
      } while (lVar9 < this->bound_);
    }
    local_40.size = (size_t)(this->lits_).ebo_.size;
    local_40.first = (int *)local_40.size;
    if ((pointer)local_40.size != (pointer)0x0) {
      local_40.first = (this->lits_).ebo_.buf;
    }
    local_68.first = &local_6c;
    local_68.size = local_50;
    local_6c = h;
    uVar5 = addRule(this,(Head_t)0x0,&local_68,&local_40);
    uVar11 = uVar11 + uVar5;
    sVar6 = (this->aux_).ebo_.size;
    if (sVar6 == 0) break;
    sVar8 = (this->lits_).ebo_.size;
    pWVar3 = (this->agg_).ebo_.buf;
    plVar4 = (this->sumR_).ebo_.buf;
    iVar2 = this->bound_;
    uVar7 = (ulong)(sVar6 - 1);
    puVar10 = (this->aux_).ebo_.buf + uVar7;
    while( true ) {
      sVar8 = sVar8 - 1;
      uVar12 = *puVar10;
      sVar6 = (size_type)uVar7;
      (this->aux_).ebo_.size = sVar6;
      (this->lits_).ebo_.size = sVar8;
      lVar9 = lVar9 - pWVar3[uVar12].weight;
      uVar12 = uVar12 + 1;
      uVar7 = (ulong)uVar12;
      if ((uVar12 != sVar1) && ((long)iVar2 <= plVar4[uVar12] + lVar9)) break;
      puVar10 = puVar10 + -1;
      uVar7 = (ulong)(sVar6 - 1);
      if (sVar6 == 0) {
        return uVar11;
      }
    }
  }
  return uVar11;
}

Assistant:

uint32 RuleTransform::Impl::transformSelect(Atom_t h) {
	lits_.clear();
	uint32 nRule = 0;
	wsum_t cw = 0;
	assert(sumR_[0] >= bound_ && cw < bound_);
	aux_.clear();
	for (uint32 it = 0, end = (uint32)agg_.size();;) {
		while (cw < bound_) {
			cw += Potassco::weight(agg_[it]);
			lits_.push_back(Potassco::lit(agg_[it]));
			aux_.push_back(it++);
		}
		nRule += addRule(h, Potassco::toSpan(lits_));
		do {
			if (aux_.empty()) { return nRule; }
			it = aux_.back();
			aux_.pop_back();
			lits_.pop_back();
			cw -= Potassco::weight(agg_[it]);
		} while (++it == end || (cw + sumR_[it]) < bound_);
	}
}